

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

bool __thiscall
RealTrafficConnection::ProcessTrafficBuffer(RealTrafficConnection *this,JSON_Object *pBuf)

{
  double dVar1;
  double dLon;
  initializer_list<unsigned_long> aIdx;
  initializer_list<unsigned_long> aIdx_00;
  initializer_list<unsigned_long> aIdx_01;
  bool bVar2;
  logLevelTy lVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  LTFlightData *this_00;
  char *pcVar8;
  string *psVar9;
  ulong uVar10;
  string *psVar11;
  JSON_Object *in_RSI;
  long *in_RDI;
  system_error *e;
  lock_guard<std::recursive_mutex> fdLock;
  LTFlightData *fd;
  unique_lock<std::mutex> mapFdLock;
  FDDynamicData dyn;
  string s;
  FDStaticData stat;
  double d;
  positionTy pos;
  double posTime;
  FDKeyTy fdKey;
  bool b;
  JSON_Array *pJAc;
  JSON_Value *pVal;
  size_t i;
  size_t numVals;
  positionTy posView;
  string acFilter;
  positionTy *in_stack_fffffffffffff988;
  FDStaticData *in_stack_fffffffffffff990;
  JSON_Object *in_stack_fffffffffffff998;
  mapped_type *in_stack_fffffffffffff9a0;
  FDKeyTy *in_stack_fffffffffffff9a8;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  undefined7 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9bf;
  positionTy *in_stack_fffffffffffff9c0;
  DataRefs *in_stack_fffffffffffff9c8;
  DataRefs *in_stack_fffffffffffff9d0;
  string *in_stack_fffffffffffff9d8;
  FDStaticData *in_stack_fffffffffffff9e0;
  FDStaticData *in_stack_fffffffffffff9e8;
  string *in_stack_fffffffffffff9f0;
  FDKeyTy *in_stack_fffffffffffff9f8;
  FDKeyTy *in_stack_fffffffffffffa00;
  FDKeyType _ty;
  FDKeyTy *in_stack_fffffffffffffa08;
  DatRequTy masterDataType;
  FDStaticData *inStat;
  bool local_509;
  byte local_4c1;
  positionTy *in_stack_fffffffffffffb58;
  mapped_type *in_stack_fffffffffffffb60;
  FDDynamicData *in_stack_fffffffffffffb68;
  LTFlightData *in_stack_fffffffffffffb70;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 *local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 *local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 *local_418;
  undefined8 local_410;
  long local_400;
  undefined1 local_3f0;
  FDKeyTy *local_3e8;
  FDStaticData *local_3e0;
  DataRefs *local_3d8;
  double local_3d0;
  allocator<char> local_3b9;
  string local_3b8 [39];
  undefined1 local_391 [40];
  allocator<char> local_369;
  string local_368 [32];
  string local_348 [64];
  string local_308 [96];
  string local_2a8 [56];
  string local_270 [56];
  string local_238 [136];
  string local_1b0 [32];
  double local_190;
  positionTy local_188;
  double local_140;
  undefined4 local_138;
  byte local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  int local_e8;
  undefined1 local_b1;
  JSON_Array *local_b0;
  string *local_a8;
  ulong local_a0;
  ulong local_98;
  string local_38 [32];
  JSON_Object *local_18;
  byte local_1;
  
  if (in_RSI == (JSON_Object *)0x0) {
    local_1 = 0;
  }
  else {
    local_18 = in_RSI;
    DataRefs::GetDebugAcFilter_abi_cxx11_(in_stack_fffffffffffff9c8);
    DataRefs::GetViewPos();
    local_98 = json_object_get_count(local_18);
    local_a0 = 0;
    while( true ) {
      local_4c1 = 0;
      if (local_a0 < local_98) {
        local_4c1 = (**(code **)(*in_RDI + 0x20))();
      }
      if (((local_4c1 & 1) == 0) ||
         (local_a8 = (string *)
                     json_object_get_value_at
                               (in_stack_fffffffffffff998,(size_t)in_stack_fffffffffffff990),
         local_a8 == (string *)0x0)) break;
      local_b0 = json_value_get_array((JSON_Value *)in_stack_fffffffffffff990);
      if (local_b0 != (JSON_Array *)0x0) {
        sVar5 = json_array_get_count(local_b0);
        if (sVar5 < 0x30) {
          lVar3 = DataRefs::GetLogLevel(&dataRefs);
          if ((int)lVar3 < 3) {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                   ,0x301,"ProcessTrafficBuffer",logWARN,"Received too few fields in a/c record %ld"
                   ,local_a0);
          }
          (**(code **)(*in_RDI + 0x40))();
        }
        else {
          lVar6 = jag_l((JSON_Array *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988);
          local_b1 = lVar6 != 0;
          jag_s((JSON_Array *)in_stack_fffffffffffff9a0,(size_t)in_stack_fffffffffffff998);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                     (allocator<char> *)in_stack_fffffffffffff9c0);
          LTFlightData::FDKeyTy::FDKeyTy
                    (in_stack_fffffffffffffa00,(FDKeyType)((ulong)in_stack_fffffffffffff9f8 >> 0x20)
                     ,in_stack_fffffffffffff9f0,(int)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator(&local_109);
          uVar4 = std::__cxx11::string::empty();
          local_131 = 0;
          local_509 = false;
          if ((uVar4 & 1) == 0) {
            std::__cxx11::string::string(local_130,local_38);
            local_131 = 1;
            local_509 = LTFlightData::FDKeyTy::operator!=
                                  ((FDKeyTy *)in_stack_fffffffffffff990,
                                   (string *)in_stack_fffffffffffff988);
          }
          if ((local_131 & 1) != 0) {
            std::__cxx11::string::~string(local_130);
          }
          if (local_509 == false) {
            _ty = (FDKeyType)((ulong)in_stack_fffffffffffffa00 >> 0x20);
            if (local_e8 == 4) {
              LTFlightData::CheckDupKey(in_stack_fffffffffffffa08,_ty);
            }
            else {
              LTFlightData::CheckDupKey(in_stack_fffffffffffffa08,_ty);
            }
            local_140 = jag_n((JSON_Array *)in_stack_fffffffffffff990,
                              (size_t)in_stack_fffffffffffff988);
            local_140 = local_140 + (double)in_RDI[0x116];
            dVar1 = jag_n((JSON_Array *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988)
            ;
            dLon = jag_n((JSON_Array *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988);
            positionTy::positionTy
                      (&local_188,dVar1,dLon,NAN,local_140,NAN,NAN,NAN,GND_UNKNOWN,UNIT_WORLD,
                       UNIT_DEG,FPH_UNKNOWN);
            lVar6 = jag_l((JSON_Array *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988)
            ;
            if (lVar6 == 0) {
              local_188._60_4_ = local_188._60_4_ & 0xfffffcff | 0x100;
              local_190 = jag_n_nan((JSON_Array *)in_stack_fffffffffffff998,
                                    (size_t)in_stack_fffffffffffff990);
              uVar4 = std::isnan(local_190);
              if ((uVar4 & 1) == 0) {
                uVar4 = std::isnan((double)in_RDI[0x55]);
                if ((uVar4 & 1) == 0) {
                  local_190 = BaroAltToGeoAlt_ft((double)in_stack_fffffffffffff990,
                                                 (double)in_stack_fffffffffffff988);
                }
                positionTy::SetAltFt
                          ((positionTy *)in_stack_fffffffffffff990,(double)in_stack_fffffffffffff988
                          );
              }
              else {
                jag_n((JSON_Array *)in_stack_fffffffffffff990,(size_t)in_stack_fffffffffffff988);
                positionTy::SetAltFt
                          ((positionTy *)in_stack_fffffffffffff990,(double)in_stack_fffffffffffff988
                          );
              }
            }
            else {
              local_188._60_4_ = local_188._60_4_ & 0xfffffcff | 0x200;
            }
            bVar2 = positionTy::isNormal(in_stack_fffffffffffff9c0,(bool)in_stack_fffffffffffff9bf);
            if (bVar2) {
              LTFlightData::FDStaticData::FDStaticData(in_stack_fffffffffffff990);
              pcVar7 = jag_s((JSON_Array *)in_stack_fffffffffffff9a0,
                             (size_t)in_stack_fffffffffffff998);
              std::__cxx11::string::operator=(local_308,pcVar7);
              pcVar7 = jag_s((JSON_Array *)in_stack_fffffffffffff9a0,
                             (size_t)in_stack_fffffffffffff998);
              std::__cxx11::string::operator=(local_270,pcVar7);
              pcVar7 = jag_s((JSON_Array *)in_stack_fffffffffffff9a0,
                             (size_t)in_stack_fffffffffffff998);
              std::__cxx11::string::operator=(local_348,pcVar7);
              jag_s((JSON_Array *)in_stack_fffffffffffff9a0,(size_t)in_stack_fffffffffffff998);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                         (allocator<char> *)in_stack_fffffffffffff9c0);
              this_00 = (LTFlightData *)
                        jag_s((JSON_Array *)in_stack_fffffffffffff9a0,
                              (size_t)in_stack_fffffffffffff998);
              inStat = (FDStaticData *)local_391;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                         (allocator<char> *)in_stack_fffffffffffff9c0);
              LTFlightData::FDStaticData::setOrigDest
                        (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
                         (string *)in_stack_fffffffffffff9d0);
              std::__cxx11::string::~string((string *)(local_391 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_391);
              std::__cxx11::string::~string(local_368);
              std::allocator<char>::~allocator(&local_369);
              pcVar7 = jag_s((JSON_Array *)in_stack_fffffffffffff9a0,
                             (size_t)in_stack_fffffffffffff998);
              std::__cxx11::string::operator=(local_238,pcVar7);
              pcVar8 = jag_s((JSON_Array *)in_stack_fffffffffffff9a0,
                             (size_t)in_stack_fffffffffffff998);
              masterDataType = (DatRequTy)((ulong)pcVar8 >> 0x20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                         (allocator<char> *)in_stack_fffffffffffff9c0);
              std::allocator<char>::~allocator(&local_3b9);
              pcVar8 = GetADSBEmitterCat((string *)in_stack_fffffffffffff9a8);
              std::__cxx11::string::operator=(local_2a8,pcVar8);
              bVar2 = std::operator==(&in_stack_fffffffffffff990->reg,
                                      (char *)in_stack_fffffffffffff988);
              if (bVar2) {
                std::__cxx11::string::operator=(local_308,"AS20");
              }
              bVar2 = std::operator==(&in_stack_fffffffffffff990->reg,
                                      (char *)in_stack_fffffffffffff988);
              if ((((bVar2) ||
                   (bVar2 = std::operator==(&in_stack_fffffffffffff990->reg,
                                            (char *)in_stack_fffffffffffff988), bVar2)) ||
                  (bVar2 = std::operator==(&in_stack_fffffffffffff990->reg,
                                           (char *)in_stack_fffffffffffff988), bVar2)) ||
                 ((bVar2 = std::operator==(&in_stack_fffffffffffff990->reg,
                                           (char *)in_stack_fffffffffffff988), bVar2 &&
                  (bVar2 = std::operator==(&in_stack_fffffffffffff990->reg,
                                           (char *)in_stack_fffffffffffff988), bVar2)))) {
                psVar9 = (string *)std::__cxx11::string::operator=(local_308,"TWR");
                std::__cxx11::string::operator=(local_348,psVar9);
              }
              bVar2 = std::operator==(&in_stack_fffffffffffff990->reg,
                                      (char *)in_stack_fffffffffffff988);
              if ((((bVar2) ||
                   (bVar2 = std::operator==(&in_stack_fffffffffffff990->reg,
                                            (char *)in_stack_fffffffffffff988), bVar2)) ||
                  ((bVar2 = std::operator==(&in_stack_fffffffffffff990->reg,
                                            (char *)in_stack_fffffffffffff988), bVar2 ||
                   (bVar2 = std::operator==(&in_stack_fffffffffffff990->reg,
                                            (char *)in_stack_fffffffffffff988), bVar2)))) ||
                 ((((uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) != 0 &&
                    ((local_188.f._1_1_ & 3) == 2)) &&
                   (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) != 0)) &&
                  (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) != 0)))) {
                psVar11 = DataRefs::GetDefaultCarIcaoType_abi_cxx11_(&dataRefs);
                std::__cxx11::string::operator=(local_308,(string *)psVar11);
              }
              LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)in_stack_fffffffffffff990)
              ;
              dVar1 = jag_sn((JSON_Array *)in_stack_fffffffffffff9a0,
                             (size_t)in_stack_fffffffffffff998);
              local_400 = lround(dVar1);
              local_3f0 = (local_188.f._1_1_ & 3) == 2;
              local_438 = 0x19;
              uStack_430 = 3;
              local_428 = 0x18;
              local_418 = &local_438;
              local_410 = 3;
              aIdx._M_array._7_1_ = in_stack_fffffffffffff9b7;
              aIdx._M_array._0_7_ = in_stack_fffffffffffff9b0;
              aIdx._M_len._0_7_ = in_stack_fffffffffffff9b8;
              aIdx._M_len._7_1_ = in_stack_fffffffffffff9bf;
              local_a8 = (string *)
                         jag_FindFirstNonNull((JSON_Array *)in_stack_fffffffffffff9a8,aIdx);
              if (local_a8 == (string *)0x0) {
                in_stack_fffffffffffff9f8 = (FDKeyTy *)0x7ff8000000000000;
              }
              else {
                in_stack_fffffffffffff9f8 =
                     (FDKeyTy *)json_value_get_number((JSON_Value *)in_stack_fffffffffffff990);
              }
              in_stack_fffffffffffffa08 = in_stack_fffffffffffff9f8;
              local_3e8 = in_stack_fffffffffffff9f8;
              in_stack_fffffffffffffa00 = (FDKeyTy *)positionTy::heading(&local_188);
              *(FDKeyTy **)in_stack_fffffffffffffa00 = in_stack_fffffffffffff9f8;
              local_468 = 5;
              uStack_460 = 0x14;
              local_458 = 0x13;
              local_448 = &local_468;
              local_440 = 3;
              aIdx_00._M_array._7_1_ = in_stack_fffffffffffff9b7;
              aIdx_00._M_array._0_7_ = in_stack_fffffffffffff9b0;
              aIdx_00._M_len._0_7_ = in_stack_fffffffffffff9b8;
              aIdx_00._M_len._7_1_ = in_stack_fffffffffffff9bf;
              in_stack_fffffffffffff9f0 =
                   (string *)jag_FindFirstNonNull((JSON_Array *)in_stack_fffffffffffff9a8,aIdx_00);
              local_a8 = in_stack_fffffffffffff9f0;
              if (in_stack_fffffffffffff9f0 == (string *)0x0) {
                in_stack_fffffffffffff9e0 = (FDStaticData *)0x0;
              }
              else {
                in_stack_fffffffffffff9e0 =
                     (FDStaticData *)json_value_get_number((JSON_Value *)in_stack_fffffffffffff990);
                in_stack_fffffffffffff9e8 = in_stack_fffffffffffff9e0;
              }
              local_488 = 0xf;
              local_480 = 0x1a;
              local_478 = &local_488;
              local_470 = 2;
              aIdx_01._M_array._7_1_ = in_stack_fffffffffffff9b7;
              aIdx_01._M_array._0_7_ = in_stack_fffffffffffff9b0;
              aIdx_01._M_len._0_7_ = in_stack_fffffffffffff9b8;
              aIdx_01._M_len._7_1_ = in_stack_fffffffffffff9bf;
              local_3e0 = in_stack_fffffffffffff9e0;
              in_stack_fffffffffffff9d8 =
                   (string *)jag_FindFirstNonNull((JSON_Array *)in_stack_fffffffffffff9a8,aIdx_01);
              local_a8 = in_stack_fffffffffffff9d8;
              if (in_stack_fffffffffffff9d8 == (string *)0x0) {
                in_stack_fffffffffffff9c8 = (DataRefs *)0x0;
              }
              else {
                in_stack_fffffffffffff9c8 =
                     (DataRefs *)json_value_get_number((JSON_Value *)in_stack_fffffffffffff990);
                in_stack_fffffffffffff9d0 = in_stack_fffffffffffff9c8;
              }
              local_3d8 = in_stack_fffffffffffff9c8;
              in_stack_fffffffffffff9c0 = (positionTy *)positionTy::ts(&local_188);
              local_3d0 = in_stack_fffffffffffff9c0->_lat;
              std::unique_lock<std::mutex>::unique_lock
                        ((unique_lock<std::mutex> *)in_stack_fffffffffffff990,
                         (mutex_type *)in_stack_fffffffffffff988);
              in_stack_fffffffffffff9a0 =
                   std::
                   map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                   ::operator[]((map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                                 *)in_stack_fffffffffffff9d0,(key_type *)in_stack_fffffffffffff9c8);
              in_stack_fffffffffffff9b8 = SUB87(in_stack_fffffffffffff9a0,0);
              in_stack_fffffffffffff9bf = (undefined1)((ulong)in_stack_fffffffffffff9a0 >> 0x38);
              std::lock_guard<std::recursive_mutex>::lock_guard
                        ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffff990,
                         (mutex_type *)in_stack_fffffffffffff988);
              std::unique_lock<std::mutex>::unlock
                        ((unique_lock<std::mutex> *)in_stack_fffffffffffff990);
              in_stack_fffffffffffff9b7 = LTFlightData::empty((LTFlightData *)0x223945);
              if ((bool)in_stack_fffffffffffff9b7) {
                LTFlightData::SetKey
                          ((LTFlightData *)
                           CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                           in_stack_fffffffffffff9a8);
              }
              in_stack_fffffffffffffb60 = in_stack_fffffffffffff9a0;
              in_stack_fffffffffffff9a8 =
                   (FDKeyTy *)
                   positionTy::dist((positionTy *)in_stack_fffffffffffff990,
                                    in_stack_fffffffffffff988);
              LTFlightData::UpdateData(this_00,inStat,(double)pcVar7,masterDataType);
              LTFlightData::AddDynData
                        (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                         (int)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                         (int)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
              std::lock_guard<std::recursive_mutex>::~lock_guard
                        ((lock_guard<std::recursive_mutex> *)0x223a3c);
              std::unique_lock<std::mutex>::~unique_lock
                        ((unique_lock<std::mutex> *)in_stack_fffffffffffff990);
              std::__cxx11::string::~string(local_3b8);
              LTFlightData::FDStaticData::~FDStaticData(in_stack_fffffffffffff990);
              local_138 = 0;
            }
            else {
              lVar3 = DataRefs::GetLogLevel(&dataRefs);
              if ((int)lVar3 < 1) {
                pcVar7 = LTFlightData::FDKeyTy::c_str((FDKeyTy *)0x222f78);
                positionTy::dbgTxt_abi_cxx11_((positionTy *)in_stack_fffffffffffffb60);
                in_stack_fffffffffffff988 = (positionTy *)std::__cxx11::string::c_str();
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                       ,0x32f,"ProcessTrafficBuffer",logDEBUG,"A/c %s reached invalid pos: %s",
                       pcVar7);
                std::__cxx11::string::~string(local_1b0);
              }
              local_138 = 4;
            }
          }
          else {
            local_138 = 4;
          }
          LTFlightData::FDKeyTy::~FDKeyTy((FDKeyTy *)0x223b57);
        }
      }
      local_a0 = local_a0 + 1;
    }
    local_1 = 1;
    local_138 = 1;
    std::__cxx11::string::~string(local_38);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool RealTrafficConnection::ProcessTrafficBuffer (const JSON_Object* pBuf)
{
    // Quick exit if no data
    if (!pBuf) return false;
    
    // any a/c filter defined for debugging purposes?
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );
    
    // Current camera position
    const positionTy posView = dataRefs.GetViewPos();
    
    // The data is delivered in many many values,
    // ie. each plane is just a JSON_Value, its name being the hexid,
    // its value being an array with the details.
    // That means we need to traverse all values, not knowing which are in there.
    // Most are planes, but some are just ordinary values like "status" or "rll"...
    // Really bad data structure design if you'd ask me...
    //   {
    //     "a1bc56": ["a1bc56",34.21124,-118.939533, ...],
    //     "a1ef41": ["a1ef41",34.263657,-118.863373, ...],
    //     ...
    //     "a26738": ["a26738",33.671356,-117.867284, ...],
    //     "full_count": 13501, "source": "MemoryDB", "rrl": 2000, "status": 200, "dataepoch": 1703885732
    //   }
    const size_t numVals = json_object_get_count(pBuf);
    for (size_t i = 0; i < numVals && shallRun(); ++i)
    {
        // Get the array 'behind' the i-th value,
        // will fail if it is no aircraft entry
        const JSON_Value* pVal = json_object_get_value_at(pBuf, i);
        if (!pVal) break;
        const JSON_Array* pJAc = json_value_get_array(pVal);
        if (!pJAc) continue;                  // probably not an aircraft line
        
        // Check for minimum number of fields
        if (json_array_get_count(pJAc) < RT_DRCT_NUM_FIELDS) {
            LOG_MSG(logWARN, "Received too few fields in a/c record %ld", (long)i);
            IncErrCnt();
            continue;
        }
        
        // the key: transponder Icao code
        bool b = jag_l(pJAc, RT_DRCT_ICAO_ID) != 0;   // is an ICAO id?
        LTFlightData::FDKeyTy fdKey (b ? LTFlightData::KEY_ICAO : LTFlightData::KEY_RT,
                                     jag_s(pJAc, RT_DRCT_HexId));
        // not matching a/c filter? -> skip it
        if ((!acFilter.empty() && (fdKey != acFilter)) )
            continue;

        // Check for duplicates with OGN/FLARM, potentially replaces the key type
        if (fdKey.eKeyType == LTFlightData::KEY_ICAO)
            LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_FLARM);
        else
            // Some codes are otherwise often duplicate with ADSBEx
            LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_ADSBEX);
        
        // position time
        double posTime = jag_n(pJAc, RT_DRCT_TimeStamp);
        //  (needs adjustment in case we are receiving historical data)
        posTime += tsAdjust;
        
        // position
        positionTy pos (jag_n(pJAc, RT_DRCT_Lat),
                        jag_n(pJAc, RT_DRCT_Lon),
                        NAN,                            // we take care of altitude next
                        posTime);
        if (jag_l(pJAc, RT_DRCT_Gnd) != 0)              // on ground?
            pos.f.onGrnd = GND_ON;
        else {
            pos.f.onGrnd = GND_OFF;
            double d = jag_n_nan(pJAc, RT_DRCT_BaroAlt);    // prefer baro altitude
            if (!std::isnan(d)) {
                if (!std::isnan(rtWx.QNH))
                    d = BaroAltToGeoAlt_ft(d, rtWx.QNH);
                pos.SetAltFt(d);
            }
            else                                        // else try geo altitude
                pos.SetAltFt(jag_n(pJAc, RT_DRCT_GeoAlt));
        }
        // position is rather important, we check for validity
        // (we do allow alt=NAN if on ground)
        if ( !pos.isNormal(true) ) {
            LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
            continue;
        }
        
        // Static data
        LTFlightData::FDStaticData stat;
        stat.acTypeIcao         = jag_s(pJAc, RT_DRCT_AcType);
        stat.call               = jag_s(pJAc, RT_DRCT_CallSign);
        stat.reg                = jag_s(pJAc, RT_DRCT_Reg);
        stat.setOrigDest(         jag_s(pJAc, RT_DRCT_Origin),
                                  jag_s(pJAc, RT_DRCT_Dest)  );
        stat.flight             = jag_s(pJAc, RT_DRCT_FlightNum);
        
        std::string s           = jag_s(pJAc, RT_DRCT_Category);
        stat.catDescr           = GetADSBEmitterCat(s);
        
        // RealTraffic often sends ASW20 when it should be AS20, a glider
        if (stat.acTypeIcao == "ASW20") stat.acTypeIcao = "AS20";
        
        // Static objects are all equally marked with a/c type TWR
        if ((s == "C3" || s == "C4" || s == "C5") ||
            (stat.reg == STATIC_OBJECT_TYPE && stat.acTypeIcao == STATIC_OBJECT_TYPE))
        {
            stat.reg = stat.acTypeIcao = STATIC_OBJECT_TYPE;
        }

        // Vehicle?
        if (stat.acTypeIcao == "GRND" || stat.acTypeIcao == "GND" ||// some vehicles come with type 'GRND'...
            s == "C1" || s == "C2" ||                               // emergency/surface vehicle?
            (s.empty() && (pos.f.onGrnd == GND_ON) && stat.acTypeIcao.empty() && stat.reg.empty()))
            stat.acTypeIcao = dataRefs.GetDefaultCarIcaoType();

        // Dynamic data
        LTFlightData::FDDynamicData dyn;
        dyn.radar.code          = std::lround(jag_sn(pJAc, RT_DRCT_Squawk));
        dyn.gnd                 = pos.f.onGrnd == GND_ON;
        // Heading: try in this order: True Heading, Track, Magnetic heading
        pVal                    = jag_FindFirstNonNull(pJAc,
                                                       { RT_DRCT_HeadTrue,
                                                         RT_DRCT_Track,
                                                         RT_DRCT_HeadMag });
        pos.heading() = dyn.heading = pVal ? json_value_get_number(pVal) : NAN;
        // Speed: try in this order: ground speed, TAS, IAS, 0.0
        pVal                    = jag_FindFirstNonNull(pJAc,
                                                       { RT_DRCT_GndSpeed,
                                                         RT_DRCT_TAS,
                                                         RT_DRCT_IAS });
        dyn.spd = pVal ? json_value_get_number(pVal) : 0.0;
        // VSI: try in this order barometric and geometric vertical speed
        pVal                    = jag_FindFirstNonNull(pJAc,
                                                       { RT_DRCT_BaroVertRate,
                                                         RT_DRCT_GeoVertRate });
        dyn.vsi = pVal ? json_value_get_number(pVal) : 0.0;
        
        dyn.ts = pos.ts();
        dyn.pChannel = this;
        
        try {
            // from here on access to fdMap guarded by a mutex
            // until FD object is inserted and updated
            std::unique_lock<std::mutex> mapFdLock (mapFdMutex);

            // get the fd object from the map, key is the transpIcao
            // this fetches an existing or, if not existing, creates a new one
            LTFlightData& fd = mapFd[fdKey];
            
            // also get the data access lock once and for all
            // so following fetch/update calls only make quick recursive calls
            std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
            // now that we have the detail lock we can release the global one
            mapFdLock.unlock();

            // completely new? fill key fields
            if ( fd.empty() )
                fd.SetKey(fdKey);
            
            // add the static data
            fd.UpdateData(std::move(stat), pos.dist(posView));

            // add the dynamic data
            fd.AddDynData(dyn, 0, 0, &pos);

        } catch(const std::system_error& e) {
            LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
            IncErrCnt();
        }
    }
    
    return true;
}